

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

wchar_t * fmt::v6::internal::write_exponent<wchar_t,wchar_t*>(int exp,wchar_t *it)

{
  wchar_t *pwVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  
  uVar3 = (ulong)(uint)-exp;
  if (0 < exp) {
    uVar3 = (ulong)(uint)exp;
  }
  *it = (exp >> 0x1f) * -2 + L'+';
  pwVar1 = it + 1;
  uVar2 = (uint)uVar3;
  if (99 < uVar2) {
    iVar4 = (int)(uVar3 / 100);
    uVar3 = (ulong)(uint)(iVar4 + (int)(uVar3 / 100));
    if (999 < uVar2) {
      it[1] = (int)(char)basic_data<void>::digits[uVar3];
      pwVar1 = it + 2;
    }
    uVar2 = uVar2 + iVar4 * -100;
    *pwVar1 = (int)(char)basic_data<void>::digits[uVar3 + 1];
    pwVar1 = pwVar1 + 1;
  }
  *pwVar1 = (int)(char)basic_data<void>::digits[(ulong)uVar2 * 2];
  pwVar1[1] = (int)(char)basic_data<void>::digits[(ulong)uVar2 * 2 + 1];
  return pwVar1 + 2;
}

Assistant:

It write_exponent(int exp, It it) {
  FMT_ASSERT(-10000 < exp && exp < 10000, "exponent out of range");
  if (exp < 0) {
    *it++ = static_cast<Char>('-');
    exp = -exp;
  } else {
    *it++ = static_cast<Char>('+');
  }
  if (exp >= 100) {
    const char* top = data::digits + (exp / 100) * 2;
    if (exp >= 1000) *it++ = static_cast<Char>(top[0]);
    *it++ = static_cast<Char>(top[1]);
    exp %= 100;
  }
  const char* d = data::digits + exp * 2;
  *it++ = static_cast<Char>(d[0]);
  *it++ = static_cast<Char>(d[1]);
  return it;
}